

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall chrono::ChSharedMassBody::ArchiveOUT(ChSharedMassBody *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChSharedMassBody>(marchive);
  local_28._value = &this->mass;
  local_28._name = "mass";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChSharedMassBody::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChSharedMassBody>();

    // serialize all member data:
    marchive << CHNVP(mass);
    ////marchive << CHNVP(inertia);
}